

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_encode_plaintext(uint16_t *plaintext,uint p,BinarySink *bs)

{
  ushort uVar1;
  uint uVar2;
  ulong uStack_30;
  uint encoding;
  size_t i;
  uint bitpos;
  uint byte;
  BinarySink *bs_local;
  uint p_local;
  uint16_t *plaintext_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  for (uStack_30 = 0; uStack_30 < p; uStack_30 = uStack_30 + 1) {
    uVar1 = plaintext[uStack_30];
    uVar2 = iszero((uint16_t)((int)(uint)plaintext[uStack_30] >> 1));
    i._4_4_ = (uVar1 + 1) * uVar2 << ((byte)(int)i & 0x1f) | i._4_4_;
    i._0_4_ = (int)i + 2;
    if (((int)i == 8) || (uStack_30 + 1 == (ulong)p)) {
      BinarySink_put_byte(bs->binarysink_,(uchar)i._4_4_);
      i._4_4_ = 0;
      i._0_4_ = 0;
    }
  }
  return;
}

Assistant:

void ntru_encode_plaintext(const uint16_t *plaintext, unsigned p,
                           BinarySink *bs)
{
    unsigned byte = 0, bitpos = 0;
    for (size_t i = 0; i < p; i++) {
        unsigned encoding = (plaintext[i] + 1) * iszero(plaintext[i] >> 1);
        byte |= encoding << bitpos;
        bitpos += 2;
        if (bitpos == 8 || i+1 == p) {
            put_byte(bs, byte);
            byte = 0;
            bitpos = 0;
        }
    }
}